

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O0

void __thiscall helics::TimeCoordinator::generateDebuggingTimeInfo(TimeCoordinator *this,json *base)

{
  initializer_list_t init;
  bool bVar1;
  reference other;
  json timeblock;
  pair<TimeRepresentation<count_time<9,_long>_>,_int> *blk;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>
  *__range1;
  json sent;
  json tblock;
  json upBlock;
  vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>
  *in_stack_fffffffffffffd38;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffffd40;
  reference in_stack_fffffffffffffd48;
  iterator in_stack_fffffffffffffd50;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *this_00;
  size_type in_stack_fffffffffffffd58;
  char *in_stack_fffffffffffffd88;
  char *key;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffffd90;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *this_01;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffffd98;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffffda0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *this_02;
  json *in_stack_fffffffffffffe48;
  json_value in_stack_fffffffffffffe50;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  local_1a0 [2];
  reference local_180;
  pair<TimeRepresentation<count_time<9,_long>_>,_int> *local_178;
  __normal_iterator<const_std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_*,_std::vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>_>
  local_170;
  json *in_stack_fffffffffffffe98;
  TimeCoordinator *in_stack_fffffffffffffea0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  local_130;
  char local_120 [7];
  undefined1 in_stack_fffffffffffffee7;
  TimeData *in_stack_fffffffffffffee8;
  json *in_stack_fffffffffffffef0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  local_100 [2];
  double local_e0;
  double local_c8;
  double local_b0;
  double local_98;
  double local_80;
  double local_68;
  double local_50;
  double local_28;
  
  generateConfig(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  local_28 = TimeRepresentation::operator_cast_to_double
                       ((TimeRepresentation<count_time<9,_long>_> *)0x5556e8);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json<double,_double,_0>(in_stack_fffffffffffffd40,(double *)in_stack_fffffffffffffd38);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  ::operator[]<char_const>(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json(in_stack_fffffffffffffd40);
  local_50 = TimeRepresentation::operator_cast_to_double
                       ((TimeRepresentation<count_time<9,_long>_> *)0x555762);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json<double,_double,_0>(in_stack_fffffffffffffd40,(double *)in_stack_fffffffffffffd38);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  ::operator[]<char_const>(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json(in_stack_fffffffffffffd40);
  local_68 = TimeRepresentation::operator_cast_to_double
                       ((TimeRepresentation<count_time<9,_long>_> *)0x5557dc);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json<double,_double,_0>(in_stack_fffffffffffffd40,(double *)in_stack_fffffffffffffd38);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  ::operator[]<char_const>(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json(in_stack_fffffffffffffd40);
  local_80 = TimeRepresentation::operator_cast_to_double
                       ((TimeRepresentation<count_time<9,_long>_> *)0x555856);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json<double,_double,_0>(in_stack_fffffffffffffd40,(double *)in_stack_fffffffffffffd38);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  ::operator[]<char_const>(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json(in_stack_fffffffffffffd40);
  local_98 = TimeRepresentation::operator_cast_to_double
                       ((TimeRepresentation<count_time<9,_long>_> *)0x5558d0);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json<double,_double,_0>(in_stack_fffffffffffffd40,(double *)in_stack_fffffffffffffd38);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  ::operator[]<char_const>(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json(in_stack_fffffffffffffd40);
  local_b0 = TimeRepresentation::operator_cast_to_double
                       ((TimeRepresentation<count_time<9,_long>_> *)0x55594a);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json<double,_double,_0>(in_stack_fffffffffffffd40,(double *)in_stack_fffffffffffffd38);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  ::operator[]<char_const>(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json(in_stack_fffffffffffffd40);
  local_c8 = TimeRepresentation::operator_cast_to_double
                       ((TimeRepresentation<count_time<9,_long>_> *)0x5559c4);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json<double,_double,_0>(in_stack_fffffffffffffd40,(double *)in_stack_fffffffffffffd38);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  ::operator[]<char_const>(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json(in_stack_fffffffffffffd40);
  local_e0 = TimeRepresentation::operator_cast_to_double
                       ((TimeRepresentation<count_time<9,_long>_> *)0x555a3e);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json<double,_double,_0>(in_stack_fffffffffffffd40,(double *)in_stack_fffffffffffffd38);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  ::operator[]<char_const>(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json(in_stack_fffffffffffffd40);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  generateJsonOutputTimeData
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,(bool)in_stack_fffffffffffffee7);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  ::operator[]<char_const>(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  this_02 = local_100;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json(in_stack_fffffffffffffd40);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  generateJsonOutputTimeData
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,(bool)in_stack_fffffffffffffee7);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json(this_02,in_stack_fffffffffffffd98);
  other = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          ::operator[]<char_const>(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  key = local_120;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json(in_stack_fffffffffffffd40);
  this_01 = &local_130;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  generateJsonOutputTimeData
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,(bool)in_stack_fffffffffffffee7);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json(this_02,other);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  ::operator[]<char_const>(this_01,key);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json(in_stack_fffffffffffffd40);
  BaseTimeCoordinator::generateDebuggingTimeInfo
            ((BaseTimeCoordinator *)in_stack_fffffffffffffe50.object,in_stack_fffffffffffffe48);
  CLI::std::
  initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  ::initializer_list((initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                      *)&stack0xfffffffffffffea0);
  init._M_len = in_stack_fffffffffffffd58;
  init._M_array = in_stack_fffffffffffffd50;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::array(init);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  ::operator[]<char_const>(this_01,key);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json(in_stack_fffffffffffffd40);
  local_170._M_current =
       (pair<TimeRepresentation<count_time<9,_long>_>,_int> *)
       std::
       vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>
       ::begin(in_stack_fffffffffffffd38);
  local_178 = (pair<TimeRepresentation<count_time<9,_long>_>,_int> *)
              std::
              vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>
              ::end(in_stack_fffffffffffffd38);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_*,_std::vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>_>
                      ((__normal_iterator<const_std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_*,_std::vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>_>
                        *)in_stack_fffffffffffffd40,
                       (__normal_iterator<const_std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_*,_std::vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>_>
                        *)in_stack_fffffffffffffd38);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_180 = __gnu_cxx::
                __normal_iterator<const_std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_*,_std::vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>_>
                ::operator*(&local_170);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    TimeRepresentation::operator_cast_to_double
              ((TimeRepresentation<count_time<9,_long>_> *)0x555d57);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json<double,_double,_0>(in_stack_fffffffffffffd40,(double *)in_stack_fffffffffffffd38);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
    ::operator[]<char_const>(this_01,key);
    this_00 = local_1a0;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::operator=(this_00,in_stack_fffffffffffffd48);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::~basic_json(in_stack_fffffffffffffd40);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json<const_int_&,_int,_0>(in_stack_fffffffffffffd40,(int *)in_stack_fffffffffffffd38);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
    ::operator[]<char_const>(this_01,key);
    in_stack_fffffffffffffd40 =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          *)&stack0xfffffffffffffe48;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::operator=(this_00,in_stack_fffffffffffffd48);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::~basic_json(in_stack_fffffffffffffd40);
    in_stack_fffffffffffffd48 =
         nlohmann::json_abi_v3_11_3::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
         ::operator[]<char_const>(this_01,key);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::push_back(this_02,other);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::~basic_json(in_stack_fffffffffffffd40);
    __gnu_cxx::
    __normal_iterator<const_std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_*,_std::vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>_>
    ::operator++(&local_170);
  }
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json(in_stack_fffffffffffffd40);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json(in_stack_fffffffffffffd40);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json(in_stack_fffffffffffffd40);
  return;
}

Assistant:

void TimeCoordinator::generateDebuggingTimeInfo(nlohmann::json& base) const
{
    generateConfig(base);
    base["granted"] = static_cast<double>(time_granted);
    base["requested"] = static_cast<double>(time_requested);
    base["exec"] = static_cast<double>(time_exec);
    base["allow"] = static_cast<double>(time_allow);
    base["value"] = static_cast<double>(time_value);
    base["message"] = static_cast<double>(time_message);
    base["minde"] = static_cast<double>(time_minDe);
    base["minminde"] = static_cast<double>(time_minminDe);
    nlohmann::json upBlock;
    generateJsonOutputTimeData(upBlock, upstream);

    base["upstream"] = upBlock;
    nlohmann::json tblock;
    generateJsonOutputTimeData(tblock, total);

    base["total"] = tblock;

    nlohmann::json sent;
    generateJsonOutputTimeData(sent, lastSend);

    base["last_send"] = sent;
    BaseTimeCoordinator::generateDebuggingTimeInfo(base);
    // now add any time blocks that may be present
    base["blocks"] = nlohmann::json::array();
    for (const auto& blk : timeBlocks) {
        nlohmann::json timeblock;
        timeblock["time"] = static_cast<double>(blk.first);
        timeblock["id"] = blk.second;
        base["blocks"].push_back(std::move(timeblock));
    }
}